

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loop.cpp
# Opt level: O1

void __thiscall net_uv::UVLoop::alloc_buf(UVLoop *this,uv_buf_t *buf,size_t size)

{
  list<uv_buf_t,_std::allocator<uv_buf_t>_> *plVar1;
  size_t *psVar2;
  _List_node_base *p_Var3;
  char *pcVar4;
  _List_node_base *p_Var5;
  
  plVar1 = &this->m_freeReadBufList;
  p_Var5 = (_List_node_base *)plVar1;
  do {
    p_Var5 = (((_List_base<uv_buf_t,_std::allocator<uv_buf_t>_> *)&p_Var5->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    if (p_Var5 == (_List_node_base *)plVar1) goto LAB_0013fa59;
    p_Var3 = p_Var5[1]._M_prev;
  } while (p_Var3 != (_List_node_base *)size);
  buf->base = (char *)p_Var5[1]._M_next;
  buf->len = (size_t)p_Var3;
  psVar2 = &(this->m_freeReadBufList).super__List_base<uv_buf_t,_std::allocator<uv_buf_t>_>._M_impl.
            _M_node._M_size;
  *psVar2 = *psVar2 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var5,0x20);
  if (p_Var5 == (_List_node_base *)plVar1) {
LAB_0013fa59:
    pcVar4 = (char *)malloc(size);
    buf->base = pcVar4;
    buf->len = size;
  }
  return;
}

Assistant:

void UVLoop::alloc_buf(uv_buf_t* buf, size_t size)
{
	for (auto it = m_freeReadBufList.begin(); it != m_freeReadBufList.end(); ++it)
	{
		if (it->len == size)
		{
			buf->base = it->base;
			buf->len = it->len;
			m_freeReadBufList.erase(it);
			return;
		}
	}

	buf->base = (char*)fc_malloc(size);
	buf->len = size;
}